

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  int *piVar6;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int *local_1f0;
  cpp_dec_float<50U,_int,_void> local_1e8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  int *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_68.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_68.m_backend.exp = (eps->m_backend).exp;
  local_68.m_backend.neg = (eps->m_backend).neg;
  local_68.m_backend.fpclass = (eps->m_backend).fpclass;
  local_68.m_backend.prec_elem = (eps->m_backend).prec_elem;
  vSolveLright(this,rhs,ridx,&rn,&local_68);
  local_1b0 = this;
  local_1a8 = vec;
  if (forest == (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x0) {
    if (rn < 1) {
      uVar13 = 0;
    }
    else {
      piVar6 = (this->row).perm;
      lVar14 = 0;
      uVar11 = 0;
      do {
        uVar13 = (uint)uVar11;
        iVar3 = ridx[lVar14];
        local_1e8.exp = rhs[iVar3].m_backend.exp;
        local_1e8.neg = rhs[iVar3].m_backend.neg;
        local_1e8.data._M_elems._32_8_ = *(undefined8 *)(rhs[iVar3].m_backend.data._M_elems + 8);
        local_1e8.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar3].m_backend.data._M_elems;
        local_1e8.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar3].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar3].m_backend.data._M_elems + 4;
        local_1e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_1e8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_1e8.fpclass = rhs[iVar3].m_backend.fpclass;
        local_1e8.prec_elem = rhs[iVar3].m_backend.prec_elem;
        local_168.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_168.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_168.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_168.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_168.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_168.exp = (eps->m_backend).exp;
        local_168.neg = (eps->m_backend).neg;
        local_168.fpclass = (eps->m_backend).fpclass;
        local_168.prec_elem = (eps->m_backend).prec_elem;
        if ((local_1e8.neg == true) &&
           (local_1e8.data._M_elems[0] != 0 || local_1e8.fpclass != cpp_dec_float_finite)) {
          local_1e8.neg = false;
        }
        if ((local_168.fpclass == cpp_dec_float_NaN || local_1e8.fpclass == cpp_dec_float_NaN) ||
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_1e8,&local_168), iVar8 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&rhs[iVar3].m_backend,0);
        }
        else {
          iVar3 = piVar6[iVar3];
          uVar10 = uVar13;
          if (0 < (int)uVar13) {
            do {
              uVar12 = (uint)uVar11 - 1;
              uVar9 = uVar12 >> 1;
              uVar10 = (uint)uVar11;
              if (iVar3 <= ridx[uVar9]) break;
              ridx[uVar11] = ridx[uVar9];
              uVar11 = (ulong)uVar9;
              uVar10 = uVar9;
            } while (1 < uVar12);
          }
          uVar11 = (ulong)(uVar13 + 1);
          ridx[(int)uVar10] = iVar3;
        }
        uVar13 = (uint)uVar11;
        lVar14 = lVar14 + 1;
      } while (lVar14 < rn);
    }
  }
  else {
    if (rn < 1) {
      uVar13 = 0;
    }
    else {
      local_1f0 = forestIdx;
      local_1a0 = (this->row).perm;
      lVar14 = 0;
      uVar13 = 0;
      do {
        iVar3 = ridx[lVar14];
        local_178 = *(undefined8 *)(rhs[iVar3].m_backend.data._M_elems + 8);
        local_198 = *(undefined8 *)rhs[iVar3].m_backend.data._M_elems;
        uStack_190 = *(undefined8 *)(rhs[iVar3].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar3].m_backend.data._M_elems + 4;
        local_188 = *(undefined8 *)puVar1;
        uStack_180 = *(undefined8 *)(puVar1 + 2);
        iVar8 = rhs[iVar3].m_backend.exp;
        bVar2 = rhs[iVar3].m_backend.neg;
        fVar4 = rhs[iVar3].m_backend.fpclass;
        iVar5 = rhs[iVar3].m_backend.prec_elem;
        local_1e8.data._M_elems._32_8_ = *(undefined8 *)(rhs[iVar3].m_backend.data._M_elems + 8);
        local_1e8.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar3].m_backend.data._M_elems;
        local_1e8.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar3].m_backend.data._M_elems + 2);
        puVar1 = rhs[iVar3].m_backend.data._M_elems + 4;
        local_1e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_1e8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_128.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_128.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_128.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_128.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_128.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_128.exp = (eps->m_backend).exp;
        local_128.neg = (eps->m_backend).neg;
        local_128.fpclass = (eps->m_backend).fpclass;
        local_128.prec_elem = (eps->m_backend).prec_elem;
        local_1e8.prec_elem = iVar5;
        local_1e8.fpclass = fVar4;
        local_1e8.neg = bVar2;
        if ((bVar2 == true) && (local_1e8.data._M_elems[0] != 0 || fVar4 != cpp_dec_float_finite)) {
          local_1e8.neg = false;
        }
        local_1e8.exp = iVar8;
        if ((local_128.fpclass == cpp_dec_float_NaN || fVar4 == cpp_dec_float_NaN) ||
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_1e8,&local_128), iVar7 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&rhs[iVar3].m_backend,0);
        }
        else {
          *local_1f0 = iVar3;
          iVar7 = local_1a0[iVar3];
          uVar10 = uVar13;
          if (0 < (int)uVar13) {
            do {
              uVar9 = uVar10 - 1;
              uVar12 = uVar9 >> 1;
              if (iVar7 <= ridx[uVar12]) break;
              ridx[uVar10] = ridx[uVar12];
              uVar10 = uVar12;
            } while (1 < uVar9);
          }
          local_1f0 = local_1f0 + 1;
          uVar13 = uVar13 + 1;
          ridx[(int)uVar10] = iVar7;
          *(undefined8 *)(forest[iVar3].m_backend.data._M_elems + 8) = local_178;
          puVar1 = forest[iVar3].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar1 = local_188;
          *(undefined8 *)(puVar1 + 2) = uStack_180;
          *(undefined8 *)forest[iVar3].m_backend.data._M_elems = local_198;
          *(undefined8 *)(forest[iVar3].m_backend.data._M_elems + 2) = uStack_190;
          forest[iVar3].m_backend.exp = iVar8;
          forest[iVar3].m_backend.neg = bVar2;
          forest[iVar3].m_backend.fpclass = fVar4;
          forest[iVar3].m_backend.prec_elem = iVar5;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < rn);
    }
    *forestNum = uVar13;
  }
  vec_00 = local_1a8;
  this_00 = local_1b0;
  local_a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_a8.m_backend.exp = (eps->m_backend).exp;
  local_a8.m_backend.neg = (eps->m_backend).neg;
  local_a8.m_backend.fpclass = (eps->m_backend).fpclass;
  local_a8.m_backend.prec_elem = (eps->m_backend).prec_elem;
  rn = uVar13;
  rn = vSolveUright(local_1b0,local_1a8,idx,rhs,ridx,uVar13,&local_a8);
  if ((this_00->l).updateType == 0) {
    local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_e8.m_backend.exp = (eps->m_backend).exp;
    local_e8.m_backend.neg = (eps->m_backend).neg;
    local_e8.m_backend.fpclass = (eps->m_backend).fpclass;
    local_e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
    rn = vSolveUpdateRight(this_00,vec_00,idx,rn,&local_e8);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update(R eps,
                                     R* vec, int* idx,                       /* result */
                                     R* rhs, int* ridx, int rn,              /* rhs    */
                                     R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright(rhs, ridx, rn, eps);
   assert(rn >= 0 && rn <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn, eps);

   return rn;
}